

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>::SmallVector
          (SmallVector<slang::ast::EvalContext::Frame,_2UL> *this,Base *other)

{
  SmallVectorBase<slang::ast::EvalContext::Frame> *in_RSI;
  SmallVectorBase<slang::ast::EvalContext::Frame> *in_RDI;
  Frame *unaff_retaddr;
  Frame *in_stack_00000008;
  SmallVectorBase<slang::ast::EvalContext::Frame> *in_stack_00000010;
  
  SmallVectorBase<slang::ast::EvalContext::Frame>::SmallVectorBase(in_RDI,2);
  SmallVectorBase<slang::ast::EvalContext::Frame>::begin(in_RSI);
  SmallVectorBase<slang::ast::EvalContext::Frame>::end(in_RSI);
  SmallVectorBase<slang::ast::EvalContext::Frame>::append<const_slang::ast::EvalContext::Frame_*>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

SmallVector(const Base& other) : Base(N) { this->append(other.begin(), other.end()); }